

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunLatePeepholeOptimizations(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  undefined4 uVar1;
  undefined4 uVar2;
  VmValue **ppVVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  VmInstructionType VVar7;
  VmValue *pVVar8;
  ulong uVar9;
  VmConstant *pVVar10;
  uint uVar11;
  uint uVar12;
  VmValue *pVVar13;
  VmInstruction *pVVar14;
  VmType type;
  VmType type_00;
  
  if ((value == (VmValue *)0x0) || (pVVar8 = value, value->typeID != 4)) {
    pVVar8 = (VmValue *)0x0;
  }
  if (pVVar8 != (VmValue *)0x0) {
    pVVar8 = (VmValue *)pVVar8[1].source;
    while (pVVar8 != (VmValue *)0x0) {
      pVVar13 = (VmValue *)pVVar8[1].comment.begin;
      RunLatePeepholeOptimizations(ctx,module,pVVar8);
      pVVar8 = pVVar13;
    }
    return;
  }
  if ((value == (VmValue *)0x0) || (pVVar8 = value, value->typeID != 3)) {
    pVVar8 = (VmValue *)0x0;
  }
  if (pVVar8 != (VmValue *)0x0) {
    pVVar8 = (VmValue *)pVVar8[1].comment.end;
    while (pVVar8 != (VmValue *)0x0) {
      pVVar13 = pVVar8[1].users.little[0];
      RunLatePeepholeOptimizations(ctx,module,pVVar8);
      pVVar8 = pVVar13;
    }
    return;
  }
  if ((value == (VmValue *)0x0) || (value->typeID != 2)) {
    value = (VmValue *)0x0;
  }
  if ((VmInstruction *)value == (VmInstruction *)0x0) {
    return;
  }
  uVar11 = ((VmInstruction *)value)->cmd - VM_INST_POW;
  if (uVar11 < 0xd) {
    uVar12 = (((VmInstruction *)value)->arguments).count;
    if (uVar12 < 2) goto LAB_0028ea12;
    ppVVar3 = (((VmInstruction *)value)->arguments).data;
    pVVar14 = (VmInstruction *)ppVVar3[1];
    if ((pVVar14 == (VmInstruction *)0x0) || ((pVVar14->super_VmValue).typeID != 2)) {
      pVVar14 = (VmInstruction *)0x0;
    }
    if ((((pVVar14 != (VmInstruction *)0x0) &&
         (uVar11 = ((*ppVVar3)->type).type - VM_TYPE_INT, uVar11 < 6)) &&
        ((0x27U >> (uVar11 & 0x1f) & 1) != 0)) &&
       (pVVar14->cmd == *(VmInstructionType *)(&DAT_0036b568 + (ulong)uVar11 * 4))) {
joined_r0x0028e71a:
      if (((uVar12 == 2) && ((pVVar14->super_VmValue).users.count == 1)) &&
         (bVar6 = IsReachableLoadValue((VmInstruction *)value,pVVar14), bVar6)) {
        uVar11 = (pVVar14->arguments).count;
        if ((uVar11 == 0) || (uVar11 == 1)) goto LAB_0028ea12;
        ppVVar3 = (pVVar14->arguments).data;
        pVVar8 = *ppVVar3;
        pVVar13 = ppVVar3[1];
        pVVar10 = CreateConstantInt(ctx->allocator,(((VmInstruction *)value)->super_VmValue).source,
                                    pVVar14->cmd);
        VVar7 = anon_unknown.dwarf_233176::GetOperationWithLoad(((VmInstruction *)value)->cmd);
        if ((((VmInstruction *)value)->arguments).count == 0) goto LAB_0028ea12;
        anon_unknown.dwarf_233176::ChangeInstructionTo
                  (module,(VmInstruction *)value,VVar7,*(((VmInstruction *)value)->arguments).data,
                   pVVar8,pVVar13,&pVVar10->super_VmValue,(VmValue *)0x0,
                   &module->peepholeOptimizations);
      }
    }
  }
  else if (((VmInstruction *)value)->cmd - VM_INST_ADD < 4) {
    uVar12 = (((VmInstruction *)value)->arguments).count;
    if (uVar12 < 2) goto LAB_0028ea12;
    ppVVar3 = (((VmInstruction *)value)->arguments).data;
    pVVar14 = (VmInstruction *)ppVVar3[1];
    if ((pVVar14 == (VmInstruction *)0x0) || ((pVVar14->super_VmValue).typeID != 2)) {
      pVVar14 = (VmInstruction *)0x0;
    }
    if ((pVVar14 != (VmInstruction *)0x0) &&
       (pVVar8 = *ppVVar3, uVar1 = (pVVar8->type).type, uVar4 = (pVVar8->type).size,
       type.size = uVar4, type.type = uVar1, type.structType = (TypeBase *)pVVar14,
       bVar6 = anon_unknown.dwarf_233176::IsOperationNaturalLoad
                         (type,(VmInstruction *)0x1,SUB41(uVar11,0)), bVar6))
    goto joined_r0x0028e71a;
  }
  uVar9 = (ulong)((VmInstruction *)value)->cmd;
  if (uVar9 < 0x33) {
    if ((0x7301400000000U >> (uVar9 & 0x3f) & 1) == 0) {
      if ((0xf0000000000U >> (uVar9 & 0x3f) & 1) == 0) {
        return;
      }
      uVar11 = (((VmInstruction *)value)->arguments).count;
      if (uVar11 == 0) goto LAB_0028ea12;
      ppVVar3 = (((VmInstruction *)value)->arguments).data;
      pVVar14 = (VmInstruction *)*ppVVar3;
      if ((pVVar14 == (VmInstruction *)0x0) || ((pVVar14->super_VmValue).typeID != 2)) {
        pVVar14 = (VmInstruction *)0x0;
      }
      if (pVVar14 == (VmInstruction *)0x0) {
        return;
      }
      if (uVar11 == 1) goto LAB_0028ea12;
      pVVar8 = ppVVar3[1];
      uVar2 = (pVVar8->type).type;
      uVar5 = (pVVar8->type).size;
      type_00.size = uVar5;
      type_00.type = uVar2;
      type_00.structType = (TypeBase *)pVVar14;
      bVar6 = anon_unknown.dwarf_233176::IsOperationNaturalLoad(type_00,(VmInstruction *)0x0,false);
      if (!bVar6) {
        return;
      }
      if (uVar11 != 2) {
        return;
      }
      if ((pVVar14->super_VmValue).users.count != 1) {
        return;
      }
      bVar6 = IsReachableLoadValue((VmInstruction *)value,pVVar14);
      if (!bVar6) {
        return;
      }
      uVar11 = (pVVar14->arguments).count;
      if ((uVar11 == 0) || (uVar11 == 1)) goto LAB_0028ea12;
      ppVVar3 = (pVVar14->arguments).data;
      pVVar8 = *ppVVar3;
      pVVar13 = ppVVar3[1];
      pVVar10 = CreateConstantInt(ctx->allocator,(((VmInstruction *)value)->super_VmValue).source,
                                  pVVar14->cmd);
      VVar7 = anon_unknown.dwarf_233176::GetMirroredComparisonOperationWithLoad
                        (((VmInstruction *)value)->cmd);
    }
    else {
      uVar11 = (((VmInstruction *)value)->arguments).count;
      if (uVar11 == 0) goto LAB_0028ea12;
      ppVVar3 = (((VmInstruction *)value)->arguments).data;
      pVVar14 = (VmInstruction *)*ppVVar3;
      if ((pVVar14 == (VmInstruction *)0x0) || ((pVVar14->super_VmValue).typeID != 2)) {
        pVVar14 = (VmInstruction *)0x0;
      }
      if (pVVar14 == (VmInstruction *)0x0) {
        return;
      }
      if (uVar11 == 1) goto LAB_0028ea12;
      uVar12 = (ppVVar3[1]->type).type - VM_TYPE_INT;
      if (5 < uVar12) {
        return;
      }
      if ((0x27U >> (uVar12 & 0x1f) & 1) == 0) {
        return;
      }
      if (pVVar14->cmd != *(VmInstructionType *)(&DAT_0036b568 + (ulong)uVar12 * 4)) {
        return;
      }
      if (uVar11 != 2) {
        return;
      }
      if ((pVVar14->super_VmValue).users.count != 1) {
        return;
      }
      bVar6 = IsReachableLoadValue((VmInstruction *)value,pVVar14);
      if (!bVar6) {
        return;
      }
      uVar11 = (pVVar14->arguments).count;
      if ((uVar11 == 0) || (uVar11 == 1)) goto LAB_0028ea12;
      ppVVar3 = (pVVar14->arguments).data;
      pVVar8 = *ppVVar3;
      pVVar13 = ppVVar3[1];
      pVVar10 = CreateConstantInt(ctx->allocator,(((VmInstruction *)value)->super_VmValue).source,
                                  pVVar14->cmd);
      VVar7 = anon_unknown.dwarf_233176::GetOperationWithLoad(((VmInstruction *)value)->cmd);
    }
    if ((((VmInstruction *)value)->arguments).count < 2) {
LAB_0028ea12:
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
    }
    anon_unknown.dwarf_233176::ChangeInstructionTo
              (module,(VmInstruction *)value,VVar7,(((VmInstruction *)value)->arguments).data[1],
               pVVar8,pVVar13,&pVVar10->super_VmValue,(VmValue *)0x0,&module->peepholeOptimizations)
    ;
  }
  return;
}

Assistant:

void RunLatePeepholeOptimizations(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunLatePeepholeOptimizations(ctx, module, curr);
			curr = next;
		}
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		VmInstruction *curr = block->firstInstruction;

		while(curr)
		{
			VmInstruction *next = curr->nextSibling;
			RunLatePeepholeOptimizations(ctx, module, curr);
			curr = next;
		}
	}
	else if(VmInstruction *inst = getType<VmInstruction>(value))
	{
		switch(inst->cmd)
		{
		case VM_INST_ADD:
		case VM_INST_SUB:
		case VM_INST_MUL:
		case VM_INST_DIV:
			if(VmInstruction *rhs = getType<VmInstruction>(inst->arguments[1]))
			{
				VmValue *lhs = inst->arguments[0];

				if(IsOperationNaturalLoad(lhs->type, rhs, true) && rhs->users.size() == 1 && inst->arguments.size() == 2 && IsReachableLoadValue(inst, rhs))
				{
					VmValue *loadAddress = rhs->arguments[0];
					VmValue *loadOffset = rhs->arguments[1];

					VmConstant *loadType = CreateConstantInt(ctx.allocator, inst->source, int(rhs->cmd));

					ChangeInstructionTo(module, inst, GetOperationWithLoad(inst->cmd), inst->arguments[0], loadAddress, loadOffset, loadType, NULL, &module->peepholeOptimizations);
				}
			}
			break;
		case VM_INST_POW:
		case VM_INST_MOD:
		case VM_INST_LESS:
		case VM_INST_GREATER:
		case VM_INST_LESS_EQUAL:
		case VM_INST_GREATER_EQUAL:
		case VM_INST_EQUAL:
		case VM_INST_NOT_EQUAL:
		case VM_INST_SHL:
		case VM_INST_SHR:
		case VM_INST_BIT_AND:
		case VM_INST_BIT_OR:
		case VM_INST_BIT_XOR:
			if(VmInstruction *rhs = getType<VmInstruction>(inst->arguments[1]))
			{
				VmValue *lhs = inst->arguments[0];

				if(IsOperationNaturalLoad(lhs->type, rhs, false) && rhs->users.size() == 1 && inst->arguments.size() == 2 && IsReachableLoadValue(inst, rhs))
				{
					VmValue *loadAddress = rhs->arguments[0];
					VmValue *loadOffset = rhs->arguments[1];

					VmConstant *loadType = CreateConstantInt(ctx.allocator, inst->source, int(rhs->cmd));

					ChangeInstructionTo(module, inst, GetOperationWithLoad(inst->cmd), inst->arguments[0], loadAddress, loadOffset, loadType, NULL, &module->peepholeOptimizations);
				}
			}
			break;
		default:
			break;
		}

		switch(inst->cmd)
		{
		case VM_INST_ADD:
		case VM_INST_MUL:
		case VM_INST_EQUAL:
		case VM_INST_NOT_EQUAL:
		case VM_INST_BIT_AND:
		case VM_INST_BIT_OR:
		case VM_INST_BIT_XOR:
			if(VmInstruction *lhs = getType<VmInstruction>(inst->arguments[0]))
			{
				VmValue *rhs = inst->arguments[1];

				if(IsOperationNaturalLoad(rhs->type, lhs, false) && lhs->users.size() == 1 && inst->arguments.size() == 2 && IsReachableLoadValue(inst, lhs))
				{
					VmValue *loadAddress = lhs->arguments[0];
					VmValue *loadOffset = lhs->arguments[1];

					VmConstant *loadType = CreateConstantInt(ctx.allocator, inst->source, int(lhs->cmd));

					ChangeInstructionTo(module, inst, GetOperationWithLoad(inst->cmd), inst->arguments[1], loadAddress, loadOffset, loadType, NULL, &module->peepholeOptimizations);
				}
			}
			break;
		case VM_INST_LESS:
		case VM_INST_GREATER:
		case VM_INST_LESS_EQUAL:
		case VM_INST_GREATER_EQUAL:
			if(VmInstruction *lhs = getType<VmInstruction>(inst->arguments[0]))
			{
				VmValue *rhs = inst->arguments[1];

				if(IsOperationNaturalLoad(rhs->type, lhs, false) && lhs->users.size() == 1 && inst->arguments.size() == 2 && IsReachableLoadValue(inst, lhs))
				{
					VmValue *loadAddress = lhs->arguments[0];
					VmValue *loadOffset = lhs->arguments[1];

					VmConstant *loadType = CreateConstantInt(ctx.allocator, inst->source, int(lhs->cmd));

					ChangeInstructionTo(module, inst, GetMirroredComparisonOperationWithLoad(inst->cmd), inst->arguments[1], loadAddress, loadOffset, loadType, NULL, &module->peepholeOptimizations);
				}
			}
			break;
		default:
			break;
		}
	}
}